

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O0

void __thiscall cfdcapi_psbt_GetPsbtGlobal_Test::TestBody(cfdcapi_psbt_GetPsbtGlobal_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  char *pcVar4;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_43;
  AssertionResult gtest_ar_42;
  AssertionResult gtest_ar_41;
  AssertionResult gtest_ar_40;
  AssertionResult gtest_ar_39;
  AssertionResult gtest_ar_38;
  AssertionResult gtest_ar_37;
  AssertionResult gtest_ar_36;
  char *exp_unknown_value;
  char *unknown_key;
  AssertionResult gtest_ar_35;
  AssertionResult gtest_ar_34;
  AssertionResult gtest_ar_33;
  char *value;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  uint32_t index;
  char *pk_hex;
  char *pk;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  uint32_t list_num;
  void *pubkey_list_handle;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  char *path;
  char *fingerprint;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  char *signature;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  char *pubkey;
  AssertionResult gtest_ar_1;
  char *psbt_base64;
  void *psbt_handle;
  int net_type;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffff478;
  AssertionResult *in_stack_fffffffffffff480;
  CfdErrorCode *in_stack_fffffffffffff488;
  AssertionResult *pAVar5;
  undefined7 in_stack_fffffffffffff490;
  undefined1 in_stack_fffffffffffff497;
  void **in_stack_fffffffffffff498;
  void *in_stack_fffffffffffff4b8;
  AssertionResult *pAVar6;
  int in_stack_fffffffffffff4c4;
  void *in_stack_fffffffffffff530;
  undefined7 in_stack_fffffffffffff538;
  undefined1 in_stack_fffffffffffff53f;
  undefined7 in_stack_fffffffffffff640;
  undefined1 in_stack_fffffffffffff647;
  char *in_stack_fffffffffffff648;
  AssertionResult *in_stack_fffffffffffff650;
  undefined7 in_stack_fffffffffffff658;
  undefined1 in_stack_fffffffffffff65f;
  char *in_stack_fffffffffffff6d8;
  AssertionResult *in_stack_fffffffffffff6e0;
  uint32_t in_stack_fffffffffffff6e8;
  int in_stack_fffffffffffff6ec;
  char *in_stack_fffffffffffff6f0;
  AssertionResult *in_stack_fffffffffffff6f8;
  undefined7 in_stack_fffffffffffff718;
  undefined1 in_stack_fffffffffffff71f;
  char *in_stack_fffffffffffff720;
  AssertionResult *in_stack_fffffffffffff728;
  undefined7 in_stack_fffffffffffff730;
  undefined1 in_stack_fffffffffffff737;
  char *in_stack_fffffffffffff738;
  void **in_stack_fffffffffffff768;
  AssertionResult *in_stack_fffffffffffff770;
  uint32_t in_stack_fffffffffffff778;
  int in_stack_fffffffffffff77c;
  char *in_stack_fffffffffffff780;
  AssertionResult *in_stack_fffffffffffff788;
  undefined7 in_stack_fffffffffffff890;
  char *in_stack_fffffffffffff898;
  undefined7 in_stack_fffffffffffff8a8;
  AssertHelper local_750;
  Message local_748;
  undefined4 local_73c;
  AssertionResult local_738;
  AssertHelper local_728;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff8e0;
  uint32_t in_stack_fffffffffffff8e8;
  int in_stack_fffffffffffff8ec;
  char **in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f8;
  uint32_t in_stack_fffffffffffff8fc;
  AssertHelper in_stack_fffffffffffff900;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff908;
  AssertionResult local_6e8;
  AssertHelper local_6d8;
  Message local_6d0;
  AssertionResult local_6c8;
  AssertHelper local_6b8;
  Message local_6b0;
  undefined4 local_6a4;
  uint32_t in_stack_fffffffffffff968;
  uint32_t in_stack_fffffffffffff96c;
  AssertHelper in_stack_fffffffffffff970;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff978;
  int in_stack_fffffffffffff984;
  void *in_stack_fffffffffffff988;
  AssertHelper local_668;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  char *in_stack_fffffffffffff9b0;
  uint32_t in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9bc;
  AssertHelper in_stack_fffffffffffff9c0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9c8;
  AssertionResult local_628;
  char *local_618;
  char *local_610;
  AssertHelper local_608;
  Message local_600;
  undefined4 local_5f4;
  AssertionResult local_5f0;
  AssertHelper local_5e0;
  Message local_5d8;
  AssertionResult local_5d0;
  AssertHelper local_5c0;
  Message local_5b8;
  undefined4 local_5ac;
  AssertionResult local_5a8;
  char *local_598;
  AssertHelper local_590;
  Message local_588;
  undefined4 local_57c;
  AssertionResult local_578;
  AssertHelper local_568;
  Message local_560;
  undefined4 local_554;
  AssertionResult local_550;
  AssertHelper local_540;
  Message local_538;
  undefined4 local_52c;
  AssertionResult local_528;
  AssertHelper local_518;
  Message local_510;
  undefined4 local_504;
  AssertionResult local_500;
  AssertHelper local_4f0;
  Message local_4e8;
  AssertionResult local_4e0;
  AssertHelper local_4d0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb38;
  char *in_stack_fffffffffffffb40;
  uint32_t in_stack_fffffffffffffb48;
  int in_stack_fffffffffffffb4c;
  AssertHelper in_stack_fffffffffffffb50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb58;
  AssertionResult local_4a0;
  AssertHelper in_stack_fffffffffffffb70;
  Message local_488;
  AssertionResult local_480;
  AssertHelper local_470;
  Message local_468;
  AssertionResult local_460;
  AssertHelper local_450;
  Message local_448;
  AssertionResult local_440;
  AssertHelper local_430;
  Message local_428;
  undefined4 local_41c;
  AssertionResult local_418;
  AssertHelper local_408;
  Message local_400;
  undefined4 local_3f4;
  AssertionResult local_3f0;
  AssertHelper local_3e0;
  Message local_3d8;
  undefined4 local_3cc;
  AssertionResult local_3c8;
  AssertHelper local_3b8;
  Message local_3b0;
  AssertionResult local_3a8;
  AssertHelper local_398;
  Message local_390;
  AssertionResult local_388;
  AssertHelper local_378;
  Message local_370;
  AssertionResult local_368;
  AssertHelper local_358;
  Message local_350;
  AssertionResult local_348;
  AssertHelper local_338;
  Message local_330;
  undefined4 local_324;
  AssertionResult local_320;
  uint local_30c;
  char *local_308;
  char *local_300;
  AssertHelper local_2f8;
  Message local_2f0;
  undefined4 local_2e4;
  AssertionResult local_2e0;
  AssertHelper local_2d0;
  Message local_2c8;
  undefined4 local_2bc;
  AssertionResult local_2b8;
  uint local_2a4;
  undefined8 local_2a0;
  AssertHelper local_298;
  Message local_290;
  undefined4 local_284;
  AssertionResult local_280;
  AssertHelper local_270;
  Message local_268;
  undefined4 local_25c;
  AssertionResult local_258;
  AssertHelper local_248;
  Message local_240;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  AssertionResult local_218;
  AssertHelper local_208;
  Message local_200;
  undefined4 local_1f4;
  AssertionResult local_1f0;
  char *local_1e0;
  char *local_1d8;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined4 local_1bc;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  AssertionResult local_198;
  AssertHelper local_188;
  Message local_180;
  undefined4 local_174;
  AssertionResult local_170;
  char *local_160;
  AssertHelper local_158;
  Message local_150;
  undefined4 local_144;
  AssertionResult local_140;
  AssertHelper local_130;
  Message local_128;
  undefined4 local_11c;
  AssertionResult local_118;
  AssertHelper local_108;
  Message local_100;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 uVar7;
  char *in_stack_ffffffffffffff10;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff18;
  AssertHelper in_stack_ffffffffffffff28;
  Message local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  char *local_b0;
  undefined8 local_a8;
  undefined4 local_9c;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffff498);
  local_2c = 0;
  pAVar5 = &local_28;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff498,
             (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  if (!(bool)uVar1) {
    testing::Message::Message(local_48);
    in_stack_fffffffffffff898 =
         testing::AssertionResult::failure_message((AssertionResult *)0x39d50a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x531,in_stack_fffffffffffff898);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x39d56d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x39d5c2);
  local_61 = local_10 != 0;
  pAVar6 = &local_60;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,(type *)0x39d5f6);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x532,pcVar4);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x39d6f2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x39d76d);
  local_9c = 0;
  local_a8 = 0;
  local_b0 = 
  "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQAiACA8rQYZ3mfmJHp2oQKBNjXAU0V8a6T95Kwf/YFI1w5LzAEBR1IhApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7IQJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQlKuIgICYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkIYnWtthiwAAIAAAACAAAAAgAAAAAAMAAAAIgICkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnsYKnBHYCwAAIAAAACAAAAAgAAAAAAMAAAAAA=="
  ;
  local_14 = CfdCreatePsbtHandle(in_stack_fffffffffffff988,in_stack_fffffffffffff984,
                                 (char *)in_stack_fffffffffffff978.ptr_,
                                 (char *)in_stack_fffffffffffff970.data_,in_stack_fffffffffffff96c,
                                 in_stack_fffffffffffff968,(void **)in_stack_fffffffffffff9a0.ptr_);
  local_c4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff498,
             (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar3) {
    testing::Message::Message(&local_d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39d87e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x539,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff28,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff28);
    testing::Message::~Message((Message *)0x39d8e1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x39d939);
  if (local_14 == 0) {
    pcVar4 = 
    "xpub6EkLrUTiaMiLbMAkbLN2BdH4hWkCQT7fLQf3Q6Ymx3gAqbuFeSKHfTMVDtjcsuRtEFqJbAsjYFZMrqeDLgRSsn4yuQygK44HWPrnA7gZC2C"
    ;
    local_14 = CfdAddPsbtGlobalXpubkey
                         (in_stack_ffffffffffffff28.data_,
                          "xpub6EkLrUTiaMiLbMAkbLN2BdH4hWkCQT7fLQf3Q6Ymx3gAqbuFeSKHfTMVDtjcsuRtEFqJbAsjYFZMrqeDLgRSsn4yuQygK44HWPrnA7gZC2C"
                          ,(char *)in_stack_ffffffffffffff18.ptr_,in_stack_ffffffffffffff10,
                          (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    uVar7 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
    bVar3 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff10);
    if (!bVar3) {
      testing::Message::Message(&local_100);
      message = testing::AssertionResult::failure_message((AssertionResult *)0x39da35);
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x53e,message);
      testing::internal::AssertHelper::operator=(&local_108,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      testing::Message::~Message((Message *)0x39da98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39daf0);
    local_14 = CfdAddPsbtGlobalXpubkey
                         (in_stack_ffffffffffffff28.data_,pcVar4,
                          (char *)in_stack_ffffffffffffff18.ptr_,in_stack_ffffffffffffff10,
                          (char *)CONCAT44(uVar7,in_stack_ffffffffffffff08));
    local_11c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_118);
    if (!bVar3) {
      testing::Message::Message(&local_128);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39dbc8);
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x542,pcVar4);
      testing::internal::AssertHelper::operator=(&local_130,&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      testing::Message::~Message((Message *)0x39dc2b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39dc83);
    local_14 = CfdIsFindPsbtPubkeyRecord
                         ((void *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                          in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec,
                          in_stack_fffffffffffff8e8,(char *)in_stack_fffffffffffff8e0.ptr_);
    local_144 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_140);
    if (!bVar3) {
      testing::Message::Message(&local_150);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39dd5b);
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x545,pcVar4);
      testing::internal::AssertHelper::operator=(&local_158,&local_150);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      testing::Message::~Message((Message *)0x39ddbe);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39de16);
    local_160 = (char *)0x0;
    local_14 = CfdGetPsbtPubkeyRecord
                         (in_stack_fffffffffffff9c8.ptr_,in_stack_fffffffffffff9c0.data_,
                          in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8,
                          in_stack_fffffffffffff9b0,
                          (char **)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
    local_174 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_170);
    if (!bVar3) {
      testing::Message::Message(&local_180);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39df02);
      testing::internal::AssertHelper::AssertHelper
                (&local_188,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x54a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_188,&local_180);
      testing::internal::AssertHelper::~AssertHelper(&local_188);
      testing::Message::~Message((Message *)0x39df65);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39dfba);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_198,"\"b7665978000000002c000000\"","signature",
                 "b7665978000000002c000000",local_160);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_198);
      if (!bVar3) {
        testing::Message::Message(&local_1a0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39e069);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x54c,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        testing::Message::~Message((Message *)0x39e0cc);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39e124);
      local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff488);
      local_1bc = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff498,
                 (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                 in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
      if (!bVar3) {
        testing::Message::Message(&local_1c8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39e1e5);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x54e,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        testing::Message::~Message((Message *)0x39e248);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39e29d);
    }
    local_1d8 = (char *)0x0;
    local_1e0 = (char *)0x0;
    local_14 = CfdGetPsbtBip32Data(in_stack_fffffffffffffb58.ptr_,in_stack_fffffffffffffb50.data_,
                                   in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48,
                                   in_stack_fffffffffffffb40,(char **)in_stack_fffffffffffffb38.ptr_
                                   ,(char **)in_stack_fffffffffffffb70.data_);
    local_1f4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
    if (!bVar3) {
      testing::Message::Message(&local_200);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39e3a5);
      testing::internal::AssertHelper::AssertHelper
                (&local_208,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x554,pcVar4);
      testing::internal::AssertHelper::operator=(&local_208,&local_200);
      testing::internal::AssertHelper::~AssertHelper(&local_208);
      testing::Message::~Message((Message *)0x39e408);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39e45d);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_218,"\"b7665978\"","fingerprint","b7665978",local_1d8);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_218);
      if (!bVar3) {
        testing::Message::Message(&local_220);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39e50c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_228,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x556,pcVar4);
        testing::internal::AssertHelper::operator=(&local_228,&local_220);
        testing::internal::AssertHelper::~AssertHelper(&local_228);
        testing::Message::~Message((Message *)0x39e56f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39e5c4);
      testing::internal::CmpHelperSTREQ((internal *)&local_238,"\"0/44\"","path","0/44",local_1e0);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_238);
      if (!bVar3) {
        testing::Message::Message(&local_240);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39e665);
        testing::internal::AssertHelper::AssertHelper
                  (&local_248,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x557,pcVar4);
        testing::internal::AssertHelper::operator=(&local_248,&local_240);
        testing::internal::AssertHelper::~AssertHelper(&local_248);
        testing::Message::~Message((Message *)0x39e6c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39e720);
      local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff488);
      local_25c = 0;
      in_stack_fffffffffffff788 = &local_258;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff498,
                 (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                 in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff788);
      if (!bVar3) {
        testing::Message::Message(&local_268);
        in_stack_fffffffffffff780 =
             testing::AssertionResult::failure_message((AssertionResult *)0x39e7e1);
        testing::internal::AssertHelper::AssertHelper
                  (&local_270,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x559,in_stack_fffffffffffff780);
        testing::internal::AssertHelper::operator=(&local_270,&local_268);
        testing::internal::AssertHelper::~AssertHelper(&local_270);
        testing::Message::~Message((Message *)0x39e844);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39e89c);
      local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff488);
      local_284 = 0;
      in_stack_fffffffffffff770 = &local_280;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff498,
                 (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                 in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff770);
      in_stack_fffffffffffff77c = CONCAT13(bVar3,(int3)in_stack_fffffffffffff77c);
      if (!bVar3) {
        testing::Message::Message(&local_290);
        in_stack_fffffffffffff768 =
             (void **)testing::AssertionResult::failure_message((AssertionResult *)0x39e95d);
        testing::internal::AssertHelper::AssertHelper
                  (&local_298,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x55b,(char *)in_stack_fffffffffffff768);
        testing::internal::AssertHelper::operator=(&local_298,&local_290);
        testing::internal::AssertHelper::~AssertHelper(&local_298);
        testing::Message::~Message((Message *)0x39e9c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39ea15);
    }
    local_2a0 = 0;
    local_2a4 = 0;
    local_14 = CfdGetPsbtPubkeyList
                         (in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                          in_stack_fffffffffffff77c,in_stack_fffffffffffff778,
                          (uint32_t *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
    local_2bc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_2b8);
    if (!bVar3) {
      testing::Message::Message(&local_2c8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39eb0e);
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x561,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      testing::Message::~Message((Message *)0x39eb71);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39ebc6);
    local_2e4 = 2;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               in_stack_fffffffffffff488,(uint *)in_stack_fffffffffffff480);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
    if (!bVar3) {
      testing::Message::Message(&local_2f0);
      in_stack_fffffffffffff738 =
           testing::AssertionResult::failure_message((AssertionResult *)0x39ec73);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x562,in_stack_fffffffffffff738);
      testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
      testing::internal::AssertHelper::~AssertHelper(&local_2f8);
      testing::Message::~Message((Message *)0x39ecd6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39ed2e);
    if (local_14 == 0) {
      local_300 = (char *)0x0;
      local_308 = (char *)0x0;
      local_1d8 = (char *)0x0;
      local_1e0 = (char *)0x0;
      for (local_30c = 0; local_30c < local_2a4; local_30c = local_30c + 1) {
        local_14 = CfdGetPsbtPubkeyListData
                             ((void *)CONCAT17(uVar1,in_stack_fffffffffffff8a8),pAVar5,
                              (uint32_t)((ulong)in_stack_fffffffffffff898 >> 0x20),
                              (char **)CONCAT17(uVar2,in_stack_fffffffffffff890),(char **)pAVar6);
        local_324 = 0;
        in_stack_fffffffffffff728 = &local_320;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_fffffffffffff498,
                   (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                   in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
        in_stack_fffffffffffff737 =
             testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff728);
        if (!(bool)in_stack_fffffffffffff737) {
          testing::Message::Message(&local_330);
          in_stack_fffffffffffff720 =
               testing::AssertionResult::failure_message((AssertionResult *)0x39ee6b);
          testing::internal::AssertHelper::AssertHelper
                    (&local_338,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x56a,in_stack_fffffffffffff720);
          testing::internal::AssertHelper::operator=(&local_338,&local_330);
          testing::internal::AssertHelper::~AssertHelper(&local_338);
          testing::Message::~Message((Message *)0x39eece);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x39ef26);
        if (local_14 == 0) {
          if (local_30c == 0) {
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_348,
                       "\"xpub6EkLrUTiaMiLbMAkbLN2BdH4hWkCQT7fLQf3Q6Ymx3gAqbuFeSKHfTMVDtjcsuRtEFqJbAsjYFZMrqeDLgRSsn4yuQygK44HWPrnA7gZC2C\""
                       ,"pk",
                       "xpub6EkLrUTiaMiLbMAkbLN2BdH4hWkCQT7fLQf3Q6Ymx3gAqbuFeSKHfTMVDtjcsuRtEFqJbAsjYFZMrqeDLgRSsn4yuQygK44HWPrnA7gZC2C"
                       ,local_300);
            in_stack_fffffffffffff71f = testing::AssertionResult::operator_cast_to_bool(&local_348);
            if (!(bool)in_stack_fffffffffffff71f) {
              testing::Message::Message(&local_350);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39efe3);
              testing::internal::AssertHelper::AssertHelper
                        (&local_358,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x56d,pcVar4);
              testing::internal::AssertHelper::operator=(&local_358,&local_350);
              testing::internal::AssertHelper::~AssertHelper(&local_358);
              testing::Message::~Message((Message *)0x39f046);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39f09b);
            in_stack_fffffffffffff6f8 = &local_368;
            testing::internal::CmpHelperSTREQ
                      ((internal *)in_stack_fffffffffffff6f8,
                       "\"0488b21e04a53a8ff30000002c839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3\""
                       ,"pk_hex",
                       "0488b21e04a53a8ff30000002c839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3"
                       ,local_308);
            bVar3 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff6f8);
            if (!bVar3) {
              testing::Message::Message(&local_370);
              in_stack_fffffffffffff6f0 =
                   testing::AssertionResult::failure_message((AssertionResult *)0x39f13c);
              testing::internal::AssertHelper::AssertHelper
                        (&local_378,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x56e,in_stack_fffffffffffff6f0);
              testing::internal::AssertHelper::operator=(&local_378,&local_370);
              testing::internal::AssertHelper::~AssertHelper(&local_378);
              testing::Message::~Message((Message *)0x39f19f);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39f1f4);
          }
          else if (local_30c == 1) {
            in_stack_fffffffffffff6e0 = &local_388;
            testing::internal::CmpHelperSTREQ
                      ((internal *)in_stack_fffffffffffff6e0,
                       "\"xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX\""
                       ,"pk",
                       "xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX"
                       ,local_300);
            bVar3 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff6e0);
            in_stack_fffffffffffff6ec = CONCAT13(bVar3,(int3)in_stack_fffffffffffff6ec);
            if (!bVar3) {
              testing::Message::Message(&local_390);
              in_stack_fffffffffffff6d8 =
                   testing::AssertionResult::failure_message((AssertionResult *)0x39f2a8);
              testing::internal::AssertHelper::AssertHelper
                        (&local_398,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x570,in_stack_fffffffffffff6d8);
              testing::internal::AssertHelper::operator=(&local_398,&local_390);
              testing::internal::AssertHelper::~AssertHelper(&local_398);
              testing::Message::~Message((Message *)0x39f30b);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39f360);
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_3a8,
                       "\"0488b21e0691fe4d298000002cb26a08008723cc8f19ac08bce635c087d63d738b63c33e62186d43cf3a5805f302e9156620b5b29e8272e86f1d81fb07d6c57c557cbc25218dfde33ab8cea06b7b\""
                       ,"pk_hex",
                       "0488b21e0691fe4d298000002cb26a08008723cc8f19ac08bce635c087d63d738b63c33e62186d43cf3a5805f302e9156620b5b29e8272e86f1d81fb07d6c57c557cbc25218dfde33ab8cea06b7b"
                       ,local_308);
            bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
            if (!bVar3) {
              testing::Message::Message(&local_3b0);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39f401);
              testing::internal::AssertHelper::AssertHelper
                        (&local_3b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x571,pcVar4);
              testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
              testing::internal::AssertHelper::~AssertHelper(&local_3b8);
              testing::Message::~Message((Message *)0x39f464);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39f4b9);
          }
          local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff488);
          local_3cc = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_fffffffffffff498,
                     (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                     in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
          bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_3c8);
          if (!bVar3) {
            testing::Message::Message(&local_3d8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39f57e);
            testing::internal::AssertHelper::AssertHelper
                      (&local_3e0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x574,pcVar4);
            testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
            testing::internal::AssertHelper::~AssertHelper(&local_3e0);
            testing::Message::~Message((Message *)0x39f5e1);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x39f639);
          local_300 = (char *)0x0;
          local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff488);
          local_3f4 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_fffffffffffff498,
                     (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                     in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
          bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_3f0);
          if (!bVar3) {
            testing::Message::Message(&local_400);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39f706);
            testing::internal::AssertHelper::AssertHelper
                      (&local_408,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x577,pcVar4);
            testing::internal::AssertHelper::operator=(&local_408,&local_400);
            testing::internal::AssertHelper::~AssertHelper(&local_408);
            testing::Message::~Message((Message *)0x39f769);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x39f7be);
          local_308 = (char *)0x0;
        }
        local_14 = CfdGetPsbtPubkeyListBip32Data
                             (in_stack_fffffffffffff908.ptr_,in_stack_fffffffffffff900.data_,
                              in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0,
                              (char **)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8)
                              ,(char **)in_stack_fffffffffffff8e0.ptr_);
        local_41c = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_fffffffffffff498,
                   (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                   in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
        bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_418);
        if (!bVar3) {
          testing::Message::Message(&local_428);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39f8b4);
          testing::internal::AssertHelper::AssertHelper
                    (&local_430,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x57b,pcVar4);
          testing::internal::AssertHelper::operator=(&local_430,&local_428);
          testing::internal::AssertHelper::~AssertHelper(&local_430);
          testing::Message::~Message((Message *)0x39f917);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x39f96f);
        CfdcapiPsbtDumpLog(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4b8);
        if (local_14 == 0) {
          if (local_30c == 0) {
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_440,
                       "\"xpub6EkLrUTiaMiLbMAkbLN2BdH4hWkCQT7fLQf3Q6Ymx3gAqbuFeSKHfTMVDtjcsuRtEFqJbAsjYFZMrqeDLgRSsn4yuQygK44HWPrnA7gZC2C\""
                       ,"pk",
                       "xpub6EkLrUTiaMiLbMAkbLN2BdH4hWkCQT7fLQf3Q6Ymx3gAqbuFeSKHfTMVDtjcsuRtEFqJbAsjYFZMrqeDLgRSsn4yuQygK44HWPrnA7gZC2C"
                       ,local_300);
            bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_440);
            if (!bVar3) {
              testing::Message::Message(&local_448);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39fa40);
              testing::internal::AssertHelper::AssertHelper
                        (&local_450,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x57f,pcVar4);
              testing::internal::AssertHelper::operator=(&local_450,&local_448);
              testing::internal::AssertHelper::~AssertHelper(&local_450);
              testing::Message::~Message((Message *)0x39faa3);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39faf8);
            in_stack_fffffffffffff650 = &local_460;
            testing::internal::CmpHelperSTREQ
                      ((internal *)in_stack_fffffffffffff650,"\"b7665978\"","fingerprint","b7665978"
                       ,local_1d8);
            in_stack_fffffffffffff65f =
                 testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff650);
            if (!(bool)in_stack_fffffffffffff65f) {
              testing::Message::Message(&local_468);
              in_stack_fffffffffffff648 =
                   testing::AssertionResult::failure_message((AssertionResult *)0x39fb99);
              testing::internal::AssertHelper::AssertHelper
                        (&local_470,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x580,in_stack_fffffffffffff648);
              testing::internal::AssertHelper::operator=(&local_470,&local_468);
              testing::internal::AssertHelper::~AssertHelper(&local_470);
              testing::Message::~Message((Message *)0x39fbfc);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39fc51);
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_480,"\"0/44\"","path","0/44",local_1e0);
            in_stack_fffffffffffff647 = testing::AssertionResult::operator_cast_to_bool(&local_480);
            if (!(bool)in_stack_fffffffffffff647) {
              testing::Message::Message(&local_488);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39fcf2);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xfffffffffffffb70,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x581,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xfffffffffffffb70,&local_488);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xfffffffffffffb70);
              testing::Message::~Message((Message *)0x39fd55);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39fdaa);
          }
          else if (local_30c == 1) {
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_4a0,
                       "\"xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX\""
                       ,"pk",
                       "xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX"
                       ,local_300);
            bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_4a0);
            if (!bVar3) {
              testing::Message::Message((Message *)&stack0xfffffffffffffb58);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39fe5e);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xfffffffffffffb50,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x583,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xfffffffffffffb50,
                         (Message *)&stack0xfffffffffffffb58);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xfffffffffffffb50);
              testing::Message::~Message((Message *)0x39fec1);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39ff16);
            testing::internal::CmpHelperSTREQ
                      ((internal *)&stack0xfffffffffffffb40,"\"ae05dbb7\"","fingerprint","ae05dbb7",
                       local_1d8);
            bVar3 = testing::AssertionResult::operator_cast_to_bool
                              ((AssertionResult *)&stack0xfffffffffffffb40);
            if (!bVar3) {
              testing::Message::Message((Message *)&stack0xfffffffffffffb38);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39ffb7);
              testing::internal::AssertHelper::AssertHelper
                        (&local_4d0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x584,pcVar4);
              testing::internal::AssertHelper::operator=
                        (&local_4d0,(Message *)&stack0xfffffffffffffb38);
              testing::internal::AssertHelper::~AssertHelper(&local_4d0);
              testing::Message::~Message((Message *)0x3a001a);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a006f);
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_4e0,"\"0/44\'\"","path","0/44\'",local_1e0);
            bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_4e0);
            if (!bVar3) {
              testing::Message::Message(&local_4e8);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3a0110);
              testing::internal::AssertHelper::AssertHelper
                        (&local_4f0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x585,pcVar4);
              testing::internal::AssertHelper::operator=(&local_4f0,&local_4e8);
              testing::internal::AssertHelper::~AssertHelper(&local_4f0);
              testing::Message::~Message((Message *)0x3a0173);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a01c8);
          }
          local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff488);
          local_504 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_fffffffffffff498,
                     (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                     in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
          bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_500);
          if (!bVar3) {
            testing::Message::Message(&local_510);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3a028d);
            testing::internal::AssertHelper::AssertHelper
                      (&local_518,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x588,pcVar4);
            testing::internal::AssertHelper::operator=(&local_518,&local_510);
            testing::internal::AssertHelper::~AssertHelper(&local_518);
            testing::Message::~Message((Message *)0x3a02f0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a0348);
          local_300 = (char *)0x0;
          local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff488);
          local_52c = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_fffffffffffff498,
                     (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                     in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
          bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_528);
          if (!bVar3) {
            testing::Message::Message(&local_538);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3a0415);
            testing::internal::AssertHelper::AssertHelper
                      (&local_540,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x58b,pcVar4);
            testing::internal::AssertHelper::operator=(&local_540,&local_538);
            testing::internal::AssertHelper::~AssertHelper(&local_540);
            testing::Message::~Message((Message *)0x3a0478);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a04d0);
          local_1d8 = (char *)0x0;
          local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff488);
          local_554 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_fffffffffffff498,
                     (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                     in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
          bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_550);
          if (!bVar3) {
            testing::Message::Message(&local_560);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3a059d);
            testing::internal::AssertHelper::AssertHelper
                      (&local_568,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x58e,pcVar4);
            testing::internal::AssertHelper::operator=(&local_568,&local_560);
            testing::internal::AssertHelper::~AssertHelper(&local_568);
            testing::Message::~Message((Message *)0x3a0600);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a0655);
          local_1e0 = (char *)0x0;
        }
      }
      local_14 = CfdFreePsbtPubkeyList
                           ((void *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538),
                            in_stack_fffffffffffff530);
      local_57c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff498,
                 (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                 in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_578);
      if (!bVar3) {
        testing::Message::Message(&local_588);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3a0744);
        testing::internal::AssertHelper::AssertHelper
                  (&local_590,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x593,pcVar4);
        testing::internal::AssertHelper::operator=(&local_590,&local_588);
        testing::internal::AssertHelper::~AssertHelper(&local_590);
        testing::Message::~Message((Message *)0x3a07a7);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a07fc);
    }
    local_598 = (char *)0x0;
    local_14 = CfdGetPsbtRecord(in_stack_fffffffffffff738,
                                (void *)CONCAT17(in_stack_fffffffffffff737,in_stack_fffffffffffff730
                                                ),(int)((ulong)in_stack_fffffffffffff728 >> 0x20),
                                (uint32_t)in_stack_fffffffffffff728,in_stack_fffffffffffff720,
                                (char **)CONCAT17(in_stack_fffffffffffff71f,
                                                  in_stack_fffffffffffff718));
    local_5ac = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_5a8);
    if (!bVar3) {
      testing::Message::Message(&local_5b8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3a08e9);
      testing::internal::AssertHelper::AssertHelper
                (&local_5c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x598,pcVar4);
      testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
      testing::internal::AssertHelper::~AssertHelper(&local_5c0);
      testing::Message::~Message((Message *)0x3a094c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a09a1);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_5d0,
                 "\"0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000\""
                 ,"value",
                 "0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000"
                 ,local_598);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_5d0);
      if (!bVar3) {
        testing::Message::Message(&local_5d8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3a0a50);
        testing::internal::AssertHelper::AssertHelper
                  (&local_5e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x59a,pcVar4);
        testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
        testing::internal::AssertHelper::~AssertHelper(&local_5e0);
        testing::Message::~Message((Message *)0x3a0ab3);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a0b0b);
      local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff488);
      local_5f4 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff498,
                 (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                 in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_5f0);
      if (!bVar3) {
        testing::Message::Message(&local_600);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3a0bcc);
        testing::internal::AssertHelper::AssertHelper
                  (&local_608,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x59d,pcVar4);
        testing::internal::AssertHelper::operator=(&local_608,&local_600);
        testing::internal::AssertHelper::~AssertHelper(&local_608);
        testing::Message::~Message((Message *)0x3a0c2f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a0c84);
      local_598 = (char *)0x0;
    }
    local_610 = "97";
    local_618 = "0011223344";
    local_14 = CfdIsFindPsbtRecord((void *)CONCAT17(in_stack_fffffffffffff65f,
                                                    in_stack_fffffffffffff658),
                                   in_stack_fffffffffffff650,
                                   (int)((ulong)in_stack_fffffffffffff648 >> 0x20),
                                   (uint32_t)in_stack_fffffffffffff648,
                                   (char *)CONCAT17(in_stack_fffffffffffff647,
                                                    in_stack_fffffffffffff640));
    pAVar5 = &local_628;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
    uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
    if (!(bool)uVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffff9c8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3a0d88);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffff9c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x5a4,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffff9c0,(Message *)&stack0xfffffffffffff9c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff9c0);
      testing::Message::~Message((Message *)0x3a0deb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a0e43);
    local_14 = CfdAddPsbtRecord(in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
                                in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8,
                                &in_stack_fffffffffffff6e0->success_,in_stack_fffffffffffff6d8);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
    bVar3 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffff9b0);
    if (!bVar3) {
      testing::Message::Message((Message *)&stack0xfffffffffffff9a0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3a0f23);
      testing::internal::AssertHelper::AssertHelper
                (&local_668,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x5a7,pcVar4);
      testing::internal::AssertHelper::operator=(&local_668,(Message *)&stack0xfffffffffffff9a0);
      testing::internal::AssertHelper::~AssertHelper(&local_668);
      testing::Message::~Message((Message *)0x3a0f86);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a0fde);
    local_14 = CfdIsFindPsbtRecord((void *)CONCAT17(in_stack_fffffffffffff65f,
                                                    in_stack_fffffffffffff658),
                                   in_stack_fffffffffffff650,
                                   (int)((ulong)in_stack_fffffffffffff648 >> 0x20),
                                   (uint32_t)in_stack_fffffffffffff648,
                                   (char *)CONCAT17(in_stack_fffffffffffff647,
                                                    in_stack_fffffffffffff640));
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
    bVar3 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffff988);
    if (!bVar3) {
      testing::Message::Message((Message *)&stack0xfffffffffffff978);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3a10b6);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffff970,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x5aa,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffff970,(Message *)&stack0xfffffffffffff978);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff970);
      testing::Message::~Message((Message *)0x3a1119);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a1171);
    local_598 = (char *)0x0;
    local_14 = CfdGetPsbtRecord(in_stack_fffffffffffff738,
                                (void *)CONCAT17(in_stack_fffffffffffff737,in_stack_fffffffffffff730
                                                ),(int)((ulong)in_stack_fffffffffffff728 >> 0x20),
                                (uint32_t)in_stack_fffffffffffff728,in_stack_fffffffffffff720,
                                (char **)CONCAT17(in_stack_fffffffffffff71f,
                                                  in_stack_fffffffffffff718));
    local_6a4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
    bVar3 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffff960);
    if (!bVar3) {
      testing::Message::Message(&local_6b0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3a1251);
      testing::internal::AssertHelper::AssertHelper
                (&local_6b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x5ae,pcVar4);
      testing::internal::AssertHelper::operator=(&local_6b8,&local_6b0);
      testing::internal::AssertHelper::~AssertHelper(&local_6b8);
      testing::Message::~Message((Message *)0x3a12ae);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a1303);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_6c8,"exp_unknown_value","value",local_618,local_598);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_6c8);
      if (!bVar3) {
        testing::Message::Message(&local_6d0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3a13a7);
        testing::internal::AssertHelper::AssertHelper
                  (&local_6d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x5b0,pcVar4);
        testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
        testing::internal::AssertHelper::~AssertHelper(&local_6d8);
        testing::Message::~Message((Message *)0x3a1404);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a1459);
      local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff488);
      pAVar6 = &local_6e8;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff498,
                 (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                 in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
      if (!bVar3) {
        testing::Message::Message((Message *)&stack0xfffffffffffff908);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3a150e);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffff900,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x5b3,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffff900,(Message *)&stack0xfffffffffffff908);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff900);
        testing::Message::~Message((Message *)0x3a156b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a15c0);
      local_598 = (char *)0x0;
    }
    local_14 = CfdFreePsbtHandle((void *)CONCAT17(uVar1,in_stack_fffffffffffff538),pAVar5);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480);
    bVar3 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffff8f0);
    if (!bVar3) {
      testing::Message::Message((Message *)&stack0xfffffffffffff8e0);
      in_stack_fffffffffffff498 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x3a168b);
      testing::internal::AssertHelper::AssertHelper
                (&local_728,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x5b8,(char *)in_stack_fffffffffffff498);
      testing::internal::AssertHelper::operator=(&local_728,(Message *)&stack0xfffffffffffff8e0);
      testing::internal::AssertHelper::~AssertHelper(&local_728);
      testing::Message::~Message((Message *)0x3a16e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a173d);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffff488);
  local_73c = 0;
  pAVar5 = &local_738;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff498,
             (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             (CfdErrorCode *)pAVar5,(int *)in_stack_fffffffffffff480);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  if (!bVar3) {
    testing::Message::Message(&local_748);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3a17f4);
    testing::internal::AssertHelper::AssertHelper
              (&local_750,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x5bc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_750,&local_748);
    testing::internal::AssertHelper::~AssertHelper(&local_750);
    testing::Message::~Message((Message *)0x3a1851);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a18a6);
  return;
}

Assistant:

TEST(cfdcapi_psbt, GetPsbtGlobal) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkMainnet;
  void* psbt_handle = nullptr;
  const char* psbt_base64 = "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQAiACA8rQYZ3mfmJHp2oQKBNjXAU0V8a6T95Kwf/YFI1w5LzAEBR1IhApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7IQJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQlKuIgICYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkIYnWtthiwAAIAAAACAAAAAgAAAAAAMAAAAIgICkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnsYKnBHYCwAAIAAAACAAAAAgAAAAAAMAAAAAA==";
  ret = CfdCreatePsbtHandle(
    handle, net_type, psbt_base64, "", 0, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    const char* pubkey = "xpub6EkLrUTiaMiLbMAkbLN2BdH4hWkCQT7fLQf3Q6Ymx3gAqbuFeSKHfTMVDtjcsuRtEFqJbAsjYFZMrqeDLgRSsn4yuQygK44HWPrnA7gZC2C";
    ret = CfdAddPsbtGlobalXpubkey(handle, psbt_handle,
        pubkey, "b7665978", "0/44");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtGlobalXpubkey(handle, psbt_handle,
        "[ae05dbb7/0/44']xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX", nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdIsFindPsbtPubkeyRecord(handle, psbt_handle, kCfdPsbtRecordGloalXpub, 0, pubkey);
    EXPECT_EQ(kCfdSuccess, ret);

    char* signature = nullptr;
    ret = CfdGetPsbtPubkeyRecord(handle, psbt_handle,
        kCfdPsbtRecordGloalXpub, 0, pubkey, &signature);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("b7665978000000002c000000", signature);
      ret = CfdFreeStringBuffer(signature);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    char* fingerprint = nullptr;
    char* path = nullptr;
    ret = CfdGetPsbtBip32Data(handle, psbt_handle, kCfdPsbtRecordGloalXpub, 0, pubkey, &fingerprint, &path);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("b7665978", fingerprint);
      EXPECT_STREQ("0/44", path);
      ret = CfdFreeStringBuffer(fingerprint);
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdFreeStringBuffer(path);
      EXPECT_EQ(kCfdSuccess, ret);
    }
    void* pubkey_list_handle = nullptr;
    uint32_t list_num = 0;
    ret = CfdGetPsbtPubkeyList(handle, psbt_handle, kCfdPsbtRecordGloalXpub,
        0, &list_num, &pubkey_list_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(2, list_num);
    if (ret == kCfdSuccess) {
      char* pk = nullptr;
      char* pk_hex = nullptr;
      fingerprint = nullptr;
      path = nullptr;
      for (uint32_t index=0; index<list_num; ++index) {
        ret = CfdGetPsbtPubkeyListData(handle, pubkey_list_handle, index, &pk, &pk_hex);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret == kCfdSuccess) {
          if (index == 0) {
            EXPECT_STREQ("xpub6EkLrUTiaMiLbMAkbLN2BdH4hWkCQT7fLQf3Q6Ymx3gAqbuFeSKHfTMVDtjcsuRtEFqJbAsjYFZMrqeDLgRSsn4yuQygK44HWPrnA7gZC2C", pk);
            EXPECT_STREQ("0488b21e04a53a8ff30000002c839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3", pk_hex);
          } else if (index == 1) {
            EXPECT_STREQ("xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX", pk);
            EXPECT_STREQ("0488b21e0691fe4d298000002cb26a08008723cc8f19ac08bce635c087d63d738b63c33e62186d43cf3a5805f302e9156620b5b29e8272e86f1d81fb07d6c57c557cbc25218dfde33ab8cea06b7b", pk_hex);
          }
          ret = CfdFreeStringBuffer(pk);
          EXPECT_EQ(kCfdSuccess, ret);
          pk = nullptr;
          ret = CfdFreeStringBuffer(pk_hex);
          EXPECT_EQ(kCfdSuccess, ret);
          pk_hex = nullptr;
        }
        ret = CfdGetPsbtPubkeyListBip32Data(handle, pubkey_list_handle, index, &pk, &fingerprint, &path);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdcapiPsbtDumpLog(ret, handle);
        if (ret == kCfdSuccess) {
          if (index == 0) {
            EXPECT_STREQ("xpub6EkLrUTiaMiLbMAkbLN2BdH4hWkCQT7fLQf3Q6Ymx3gAqbuFeSKHfTMVDtjcsuRtEFqJbAsjYFZMrqeDLgRSsn4yuQygK44HWPrnA7gZC2C", pk);
            EXPECT_STREQ("b7665978", fingerprint);
            EXPECT_STREQ("0/44", path);
          } else if (index == 1) {
            EXPECT_STREQ("xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX", pk);
            EXPECT_STREQ("ae05dbb7", fingerprint);
            EXPECT_STREQ("0/44'", path);
          }
          ret = CfdFreeStringBuffer(pk);
          EXPECT_EQ(kCfdSuccess, ret);
          pk = nullptr;
          ret = CfdFreeStringBuffer(fingerprint);
          EXPECT_EQ(kCfdSuccess, ret);
          fingerprint = nullptr;
          ret = CfdFreeStringBuffer(path);
          EXPECT_EQ(kCfdSuccess, ret);
          path = nullptr;
        }
      }
      ret = CfdFreePsbtPubkeyList(handle, pubkey_list_handle);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    char* value = nullptr;
    ret = CfdGetPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeGlobal, 0, "00", &value);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000", value);

      ret = CfdFreeStringBuffer(value);
      EXPECT_EQ(kCfdSuccess, ret);
      value = nullptr;
    }

    const char* unknown_key = "97";
    const char* exp_unknown_value = "0011223344";
    ret = CfdIsFindPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeGlobal, 0, unknown_key);
    EXPECT_EQ(kCfdNotFoundError, ret);

    ret = CfdAddPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeGlobal, 0, unknown_key, exp_unknown_value);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdIsFindPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeGlobal, 0, unknown_key);
    EXPECT_EQ(kCfdSuccess, ret);

    value = nullptr;
    ret = CfdGetPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeGlobal, 0, unknown_key, &value);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_unknown_value, value);

      ret = CfdFreeStringBuffer(value);
      EXPECT_EQ(kCfdSuccess, ret);
      value = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}